

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integer_cast_operator.hpp
# Opt level: O0

bool duckdb::IntegerDecimalCastOperation::
     HandleDecimal<duckdb::IntegerDecimalCastData<unsigned_long>,_true,_true>
               (IntegerDecimalCastData<unsigned_long> *state,uint8_t digit)

{
  ulong uVar1;
  unsigned_long uVar2;
  byte in_SIL;
  long in_RDI;
  
  uVar1 = *(ulong *)(in_RDI + 8);
  uVar2 = NumericLimits<unsigned_long>::Maximum();
  if (uVar1 <= (uVar2 - in_SIL) / 10) {
    *(short *)(in_RDI + 0x10) = *(short *)(in_RDI + 0x10) + 1;
    *(ulong *)(in_RDI + 8) = *(long *)(in_RDI + 8) * 10 + (ulong)in_SIL;
  }
  return true;
}

Assistant:

static bool HandleDecimal(T &state, uint8_t digit) {
		using store_t = typename T::StoreType;
		if (DUCKDB_UNLIKELY(state.decimal > (NumericLimits<store_t>::Maximum() - digit) / 10)) {
			// Simply ignore any more decimals
			return true;
		}
		state.decimal_digits++;
		state.decimal = state.decimal * 10 + digit;
		return true;
	}